

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O0

void log<unsigned_char>(log_level level,char *format,uchar *args)

{
  uchar *args_local;
  char *format_local;
  log_level level_local;
  
  if (((console_mode != '\x01') || ((int)level < 3)) && ((int)level < 6)) {
    if (level == ERROR) {
      if (log_id == 0xff) {
        fprintf(_stderr,"\x1b[31m[ERROR] ");
      }
      else {
        fprintf(_stderr,"\x1b[31m[ERROR][%d] ",(ulong)log_id);
      }
      fprintf(_stderr,format,(ulong)*args);
      fprintf(_stderr,"\n");
    }
    else {
      switch(level) {
      case WARNING:
        printf("\x1b[33m");
        printf("[WARNING]");
        break;
      case NOTICE:
        printf("\x1b[35m");
        printf("[NOTICE]");
        break;
      case INFO:
        printf("\x1b[36m");
        printf("[INFO]");
        break;
      case DEBUG:
        printf("\x1b[32m");
        printf("[DEBUG]");
        break;
      case TRACE:
        printf("\x1b[34m");
        printf("[TRACE]");
      }
      if (log_id != 0xff) {
        printf("[%d] ",(ulong)log_id);
      }
      printf(format,(ulong)*args);
      printf("\n");
    }
  }
  return;
}

Assistant:

void log(log_level level, const char *format, Args const & ... args){
    if(console_mode == 1 and level > log_level::NOTICE){
        return;
    }
    if(level > log_level::TRACE){
        return;
    }
    if(level == log_level::ERROR){
        if(log_id == 0xff){
            fprintf(stderr, "\e[31m[ERROR] ");

        }else{
            fprintf(stderr, "\e[31m[ERROR][%d] ", log_id);
        }
        fprintf(stderr, format, args...);
        fprintf(stderr, "\n");
        return;
    }
    switch(level){
        case log_level::WARNING:
            printf("\e[33m");
            printf("[WARNING]");
            break;
        case log_level::NOTICE:
            printf("\e[35m");
            printf("[NOTICE]");
            break;
        case log_level::INFO:
            printf("\e[36m");
            printf("[INFO]");
            break;
        case log_level::DEBUG:
            printf("\e[32m");
            printf("[DEBUG]");
            break;
        case log_level::TRACE:
            printf("\e[34m");
            printf("[TRACE]");

            break;
        case log_level::ERROR:
            break;
    }
    if(log_id != 0xff){
        printf("[%d] ", log_id);
    }
    printf(format, args ...);
    printf("\n");
}